

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O3

Aig_Man_t * Saig_ManWindowExtractNodes(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  int *piVar4;
  int iVar5;
  Aig_Man_t *p_00;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  Aig_Obj_t *p1;
  int nRegs;
  long lVar12;
  
  Aig_ManCleanData(p);
  p_00 = Aig_ManStart(vNodes->nSize);
  pcVar6 = (char *)malloc(4);
  builtin_strncpy(pcVar6,"wnd",4);
  p_00->pName = pcVar6;
  p_00->pSpec = (char *)0x0;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar7 = Saig_ManWindowCollectPis(p,vNodes);
  iVar5 = pVVar7->nSize;
  ppvVar2 = pVVar7->pArray;
  if ((long)iVar5 < 1) {
    if (ppvVar2 != (void **)0x0) goto LAB_006fc7f3;
  }
  else {
    lVar12 = 0;
    do {
      pvVar3 = ppvVar2[lVar12];
      pAVar8 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar8;
      lVar12 = lVar12 + 1;
    } while (iVar5 != lVar12);
LAB_006fc7f3:
    free(ppvVar2);
  }
  free(pVVar7);
  iVar5 = vNodes->nSize;
  if (0 < iVar5) {
    lVar12 = 0;
    do {
      piVar4 = (int *)vNodes->pArray[lVar12];
      if (((piVar4[6] & 7U) == 2) && (p->nTruePis <= *piVar4)) {
        pAVar8 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)(piVar4 + 10) = pAVar8;
        iVar5 = vNodes->nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar5);
    if (0 < iVar5) {
      lVar12 = 0;
      do {
        pvVar3 = vNodes->pArray[lVar12];
        if (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7) {
          if (((ulong)pvVar3 & 1) != 0) goto LAB_006fc9bf;
          uVar9 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (uVar9 == 0) {
            pAVar8 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar8 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar9 + 0x28));
          }
          uVar9 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
          if (uVar9 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^ *(ulong *)(uVar9 + 0x28));
          }
          pAVar8 = Aig_And(p_00,pAVar8,p1);
          *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar8;
          iVar5 = vNodes->nSize;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar5);
    }
  }
  pVVar7 = Saig_ManWindowCollectPos(p,vNodes,(Vec_Ptr_t **)0x0);
  iVar5 = pVVar7->nSize;
  ppvVar2 = pVVar7->pArray;
  if ((long)iVar5 < 1) {
    if (ppvVar2 == (void **)0x0) goto LAB_006fc90f;
  }
  else {
    lVar12 = 0;
    do {
      Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)((long)ppvVar2[lVar12] + 0x28));
      lVar12 = lVar12 + 1;
    } while (iVar5 != lVar12);
  }
  free(ppvVar2);
LAB_006fc90f:
  free(pVVar7);
  iVar5 = vNodes->nSize;
  if (iVar5 < 1) {
    nRegs = 0;
  }
  else {
    lVar12 = 0;
    nRegs = 0;
    do {
      if (((*(uint *)((long)vNodes->pArray[lVar12] + 0x18) & 7) == 2) &&
         (iVar1 = *vNodes->pArray[lVar12], p->nTruePis <= iVar1)) {
        uVar11 = (iVar1 - p->nTruePis) + p->nTruePos;
        if (((int)uVar11 < 0) || (p->vCos->nSize <= (int)uVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = p->vCos->pArray[uVar11];
        if (((ulong)pvVar3 & 1) != 0) {
LAB_006fc9bf:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar9 = *(ulong *)((long)pvVar3 + 8);
        uVar10 = uVar9 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)((ulong)((uint)uVar9 & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        Aig_ObjCreateCo(p_00,pAVar8);
        nRegs = nRegs + 1;
        iVar5 = vNodes->nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar5);
  }
  Aig_ManSetRegNum(p_00,nRegs);
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManWindowExtractNodes( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMatch;
    Vec_Ptr_t * vNodesPi, * vNodesPo;
    int i, nRegCount;
    Aig_ManCleanData( p ); 
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    pNew->pName = Abc_UtilStrsav( "wnd" );
    pNew->pSpec = NULL;
    // map constant nodes
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );
    // create real PIs
    vNodesPi = Saig_ManWindowCollectPis( p, vNodes );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodesPi, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    Vec_PtrFree( vNodesPi );
    // create register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Saig_ObjIsLo(p, pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    }
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }
    // create POs
    vNodesPo = Saig_ManWindowCollectPos( p, vNodes, NULL );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodesPo, pObj, i )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
    Vec_PtrFree( vNodesPo );
    // create register inputs
    nRegCount = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pMatch = Saig_ObjLoToLi( p, pObj );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch) );
            nRegCount++;
        }
    }
    Aig_ManSetRegNum( pNew, nRegCount );
    Aig_ManCleanup( pNew );
    return pNew;
}